

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Extent>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::Extent> *this,double t)

{
  Sample local_38;
  
  local_38.value.lower._M_elems[0] = INFINITY;
  local_38.value.lower._M_elems[1] = INFINITY;
  local_38.value.lower._M_elems[2] = INFINITY;
  local_38.value.upper._M_elems[0] = -INFINITY;
  local_38.value.upper._M_elems[1] = -INFINITY;
  local_38.value.upper._M_elems[2] = -INFINITY;
  local_38.blocked = true;
  local_38.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
              *)this,&local_38);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }